

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object am_gen_one_script_line(Am_Object *cmd)

{
  Am_Slot_Key key;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  ostream *poVar5;
  Am_Value *in_RSI;
  uint in_stack_fffffffffffff8b4;
  bool local_722;
  Am_Object local_628;
  Am_Object local_620;
  Am_Object local_618;
  Am_Object local_610;
  ostrstream oss3;
  Am_Object local_4a8;
  Am_Object local_4a0;
  char local_491;
  char placeholder_char;
  ostrstream oss2;
  undefined1 local_328 [8];
  Am_Value_List part_chain;
  Am_Object local_310;
  undefined1 local_308 [8];
  Am_Value new_value;
  Am_Value object_modified_value;
  Am_Value v;
  ostrstream local_2c0 [8];
  ostrstream oss;
  ostrstream local_158 [8];
  char line [300];
  Am_Value cnt;
  Am_Object *cmd_local;
  Am_Object *group;
  
  pAVar2 = Am_Object::Peek((Am_Object *)in_RSI,Am_COMMAND_INDEX_IN_SCRIPT,0);
  Am_Value::Am_Value((Am_Value *)(line + 0x128),pAVar2);
  std::ostrstream::ostrstream(local_2c0,(char *)local_158,300,_S_out);
  reset_ostrstream(local_2c0);
  Am_Object::Create((Am_Object *)&v.value,(char *)&Am_Script_Line_Group);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)in_RSI);
  pAVar4 = Am_Object::Add((Am_Object *)&v.value,0xc5,pAVar3,0);
  Am_Object::Am_Object(cmd,pAVar4);
  Am_Object::~Am_Object((Am_Object *)&v.value);
  Am_Value::Am_Value((Am_Value *)&object_modified_value.value);
  Am_Value::Am_Value((Am_Value *)&new_value.value);
  Am_Value::Am_Value((Am_Value *)local_308);
  pAVar2 = Am_Object::Peek((Am_Object *)in_RSI,0x175,0);
  Am_Value::operator=((Am_Value *)&object_modified_value.value,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&object_modified_value.value);
  if (!bVar1) {
    pAVar2 = Am_Object::Peek((Am_Object *)in_RSI,0x151,0);
    Am_Value::operator=((Am_Value *)&object_modified_value.value,pAVar2);
    bVar1 = Am_Value::Valid((Am_Value *)&object_modified_value.value);
    if (!bVar1) {
      pAVar2 = Am_Object::Peek((Am_Object *)in_RSI,0x150,0);
      Am_Value::operator=((Am_Value *)&object_modified_value.value,pAVar2);
    }
  }
  bVar1 = Am_Value::Valid((Am_Value *)(line + 0x128));
  if (bVar1) {
    poVar5 = operator<<((ostream *)local_2c0,(Am_Value *)(line + 0x128));
    std::operator<<(poVar5,". ");
  }
  poVar5 = operator<<((ostream *)local_2c0,(Am_Value *)&object_modified_value.value);
  poVar5 = std::operator<<(poVar5," ");
  std::ostream::operator<<(poVar5,std::ends<char,std::char_traits<char>>);
  Am_Object::Create((Am_Object *)&part_chain.item,(char *)&Am_Script_Line_Command);
  pAVar4 = Am_Object::Set((Am_Object *)&part_chain.item,0xab,(char *)local_158,0);
  pAVar4 = Am_Object::Add(pAVar4,0x169,(Am_Value *)&object_modified_value.value,0);
  key = Am_TOP_SCRIPT_LINE_GROUP;
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(cmd);
  pAVar4 = Am_Object::Add(pAVar4,key,pAVar3,0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)in_RSI);
  pAVar4 = Am_Object::Add(pAVar4,0xc5,pAVar3,0);
  pAVar4 = Am_Object::Add(pAVar4,0xb8,0x175,0);
  Am_Object::Am_Object(&local_310,pAVar4);
  Am_Object::Add_Part(cmd,&local_310,true,0);
  Am_Object::~Am_Object(&local_310);
  Am_Object::~Am_Object((Am_Object *)&part_chain.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_328);
  std::ostrstream::ostrstream((ostrstream *)&stack0xfffffffffffffb70,(char *)local_158,300,_S_out);
  reset_ostrstream((ostrstream *)&stack0xfffffffffffffb70);
  pAVar2 = Am_Object::Peek((Am_Object *)in_RSI,0x16d,0);
  Am_Value::operator=((Am_Value *)&new_value.value,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)&new_value.value);
  if (bVar1) {
    local_491 = find_placeholder_char((Am_Object *)in_RSI,0x16d);
    if (local_491 != '\0') {
      poVar5 = std::operator<<((ostream *)&stack0xfffffffffffffb70,local_491);
      std::operator<<(poVar5,": ");
    }
    gen_script_list_or_value
              ((char *)&local_4a0,local_158,(Am_Object *)&stack0xfffffffffffffb70,
               &Am_Script_Line_Modified,cmd,in_RSI,(bool)((char)&new_value + '\b'),
               (Am_Object *)((ulong)in_stack_fffffffffffff8b4 << 0x20),(Am_Value_List *)cmd);
    Am_Object::~Am_Object(&local_4a0);
  }
  Am_Object::Am_Object(&local_4a8,&Am_Object_Create_Command);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)in_RSI,&local_4a8);
  Am_Object::~Am_Object(&local_4a8);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pAVar2 = Am_Object::Peek((Am_Object *)in_RSI,0x169,0);
    Am_Value::operator=((Am_Value *)local_308,pAVar2);
    bVar1 = Am_Value::Exists((Am_Value *)local_308);
    if ((bVar1) &&
       (((bVar1 = Am_Value::Valid((Am_Value *)&new_value.value), !bVar1 ||
         (local_308._0_2_ != 0xa001)) ||
        (bVar1 = Am_Value::operator!=((Am_Value *)local_308,(Am_Value *)&new_value.value), bVar1))))
    {
      std::ostrstream::ostrstream((ostrstream *)&local_610,(char *)local_158,300,_S_out);
      reset_ostrstream((ostrstream *)&local_610);
      local_491 = find_placeholder_char((Am_Object *)in_RSI,0x169);
      if (local_491 != '\0') {
        poVar5 = std::operator<<((ostream *)&local_610,local_491);
        std::operator<<(poVar5,":");
      }
      std::operator<<((ostream *)&local_610," = ");
      Am_Value_List::Make_Empty((Am_Value_List *)local_328);
      gen_script_list_or_value
                ((char *)&local_618,local_158,&local_610,&Am_Script_Line_Value,cmd,in_RSI,
                 SUB81(local_308,0),(Am_Object *)((ulong)in_stack_fffffffffffff8b4 << 0x20),
                 (Am_Value_List *)cmd);
      Am_Object::~Am_Object(&local_618);
      std::ostrstream::~ostrstream((ostrstream *)&local_610);
    }
  }
  Am_Object::Am_Object(&local_620,&Am_Object_Create_Command);
  bVar1 = Am_Object::Is_Instance_Of((Am_Object *)in_RSI,&local_620);
  local_722 = true;
  if (!bVar1) {
    Am_Object::Am_Object(&local_628,&Am_Find_Command);
    local_722 = Am_Object::Is_Instance_Of((Am_Object *)in_RSI,&local_628);
    Am_Object::~Am_Object(&local_628);
  }
  Am_Object::~Am_Object(&local_620);
  if (local_722 != false) {
    gen_create_parameters_line((Am_Object *)in_RSI,(char *)local_158,cmd);
  }
  std::ostrstream::~ostrstream((ostrstream *)&stack0xfffffffffffffb70);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_328);
  Am_Value::~Am_Value((Am_Value *)local_308);
  Am_Value::~Am_Value((Am_Value *)&new_value.value);
  Am_Value::~Am_Value((Am_Value *)&object_modified_value.value);
  std::ostrstream::~ostrstream(local_2c0);
  Am_Value::~Am_Value((Am_Value *)(line + 0x128));
  return (Am_Object)(Am_Object_Data *)cmd;
}

Assistant:

Am_Object
am_gen_one_script_line(Am_Object &cmd)
{
  Am_Value cnt = cmd.Peek(Am_COMMAND_INDEX_IN_SCRIPT);
  char line[300];
  OSTRSTREAM_CONSTR(oss, line, 300, std::ios::out);
  reset_ostrstream(oss); // go to the beginning
  Am_Object group = Am_Script_Line_Group.Create().Add(Am_COMMAND, cmd);
  Am_Value v, object_modified_value, new_value;
  v = cmd.Peek(Am_REGISTER_COMMAND);
  //if v.valid(), then there is a placeholder for the command itself
  // This only happens for match_commands
  if (!v.Valid()) {
    v = cmd.Peek(Am_SHORT_LABEL);
    if (!v.Valid())
      v = cmd.Peek(Am_LABEL);
  }
  if (cnt.Valid())
    oss << cnt << ". ";
  oss << v << " " << std::ends;
  OSTRSTREAM_COPY(oss, line, 300);
  group.Add_Part(Am_Script_Line_Command.Create()
                     .Set(Am_TEXT, line)
                     .Add(Am_VALUE, v)
                     .Add(Am_TOP_SCRIPT_LINE_GROUP, group)
                     .Add(Am_COMMAND, cmd)
                     .Add(Am_SLOTS_TO_SAVE, Am_REGISTER_COMMAND));

  Am_Value_List part_chain;
  OSTRSTREAM_CONSTR(oss2, line, 300, std::ios::out);
  reset_ostrstream(oss2); // go to the beginning
  object_modified_value = cmd.Peek(Am_OBJECT_MODIFIED);
  char placeholder_char;
  if (object_modified_value.Valid()) {
    placeholder_char = find_placeholder_char(cmd, Am_OBJECT_MODIFIED);
    if (placeholder_char)
      oss2 << placeholder_char << ": ";
    gen_script_list_or_value(line, oss2, Am_Script_Line_Modified, group, cmd,
                             object_modified_value, false, group, part_chain);
  }

  if (!cmd.Is_Instance_Of(Am_Object_Create_Command)) {
    new_value = cmd.Peek(Am_VALUE);
    if (new_value.Exists() &&
        (!object_modified_value.Valid() || new_value.type != Am_OBJECT ||
         new_value != object_modified_value)) {
      //don't output new_value if same as object_modified (as in create commands)
      OSTRSTREAM_CONSTR(oss3, line, 300, std::ios::out);
      reset_ostrstream(oss3); // go to the beginning
      placeholder_char = find_placeholder_char(cmd, Am_VALUE);
      if (placeholder_char)
        oss3 << placeholder_char << ":";
      oss3 << " = ";
      part_chain.Make_Empty();
      gen_script_list_or_value(line, oss3, Am_Script_Line_Value, group, cmd,
                               new_value, false, group, part_chain);
    } // end new_value exists
  }
  if (cmd.Is_Instance_Of(Am_Object_Create_Command) ||
      cmd.Is_Instance_Of(Am_Find_Command)) {
    gen_create_parameters_line(cmd, line, group);
  }
  return group;
}